

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputlag.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  nk_vec2 nVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar6;
  GLFWwindow *handle_00;
  nk_command_buffer *b;
  uint is_active;
  long lVar7;
  ulong uVar8;
  int height_00;
  long lVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [16];
  double dVar12;
  nk_rect r;
  nk_rect r_00;
  int old_val;
  int height;
  int width;
  int local_8c;
  int local_88;
  int local_84;
  GLFWwindow *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  ulong local_48;
  undefined8 uStack_40;
  
  bVar10 = true;
  while( true ) {
    while( true ) {
      iVar5 = getopt(argc,argv,"fh");
      if (iVar5 != 0x66) break;
      bVar10 = false;
    }
    if (iVar5 == -1) break;
    if (iVar5 == 0x68) {
      usage();
LAB_00140cdb:
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar5 = glfwInit();
  if (iVar5 == 0) {
LAB_0014077f:
    exit(1);
  }
  if (bVar10) {
    iVar5 = 0x280;
    height_00 = 0x1e0;
    handle = (GLFWmonitor *)0x0;
  }
  else {
    handle = glfwGetPrimaryMonitor();
    pGVar6 = glfwGetVideoMode(handle);
    iVar5 = pGVar6->width;
    height_00 = pGVar6->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  glfwWindowHint(0x2200c,1);
  handle_00 = glfwCreateWindow(iVar5,height_00,"Input lag test",handle,(GLFWwindow *)0x0);
  if (handle_00 == (GLFWwindow *)0x0) {
    glfwTerminate();
    goto LAB_0014077f;
  }
  glfwMakeContextCurrent(handle_00);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval((uint)(enable_vsync == 1));
  dVar1 = glfwGetTime();
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = dVar1;
  local_58._12_4_ = extraout_XMM0_Dd;
  local_8c = 1;
  nk_glfw3_init(handle_00,NK_GLFW3_INSTALL_CALLBACKS);
  memset(&glfw.atlas,0,400);
  glfw.atlas.temporary.alloc = nk_malloc;
  glfw.atlas.temporary.free = nk_mfree;
  glfw.atlas.permanent.alloc = nk_malloc;
  glfw.atlas.permanent.free = nk_mfree;
  nk_font_atlas_begin(&glfw.atlas);
  nk_glfw3_font_stash_end();
  glfwSetKeyCallback(handle_00,key_callback);
  glfwSetCursorPosCallback(handle_00,cursor_pos_callback);
  iVar5 = glfwWindowShouldClose(handle_00);
  if (iVar5 == 0) {
    local_68 = 0.0;
    dStack_60 = 0.0;
    lVar9 = 0;
    local_80 = handle_00;
    do {
      glfwPollEvents();
      sample_input(handle_00);
      glfwGetWindowSize(handle_00,&local_84,&local_88);
      local_48 = CONCAT44((float)local_88,(float)local_84);
      uStack_40 = 0;
      (*glad_glClear)(0x4000);
      nk_glfw3_new_frame();
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_48;
      iVar5 = nk_begin_titled(&glfw.ctx,"","",(nk_rect)(auVar4 << 0x40),0);
      if (iVar5 != 0) {
        b = nk_window_get_canvas(&glfw.ctx);
        lVar7 = (ulong)(local_8c != 0) * 3;
        do {
          local_78 = 0xff00ffffff0000ff;
          uStack_70 = 0xffff6000ff00ff00;
          r.x = (float)(int)lVar7 * cursor_vel.x + cursor_pos.x + -5.0;
          r.y = (float)(int)lVar7 * cursor_vel.y + cursor_pos.y + -5.0;
          r.w = 10.0;
          r.h = 10.0;
          nk_fill_circle(b,r,*(nk_color *)((long)&local_78 + lVar7 * 4));
          bVar10 = lVar7 != 0;
          lVar7 = lVar7 + -1;
        } while (bVar10);
        nk_row_layout(&glfw.ctx,NK_DYNAMIC,20.0,1,0);
        nk_text_colored(&glfw.ctx,"Move mouse uniformly and check marker under cursor:",0x33,0x11,
                        glfw.ctx.style.text.color);
        uVar8 = 0;
        do {
          nk_layout_row_begin(&glfw.ctx,NK_STATIC,12.0,2);
          nk_layout_row_push(&glfw.ctx,25.0);
          nVar2 = nk_layout_space_to_screen(&glfw.ctx,(nk_vec2)0x40a0000041a00000);
          local_78 = 0xff00ffffff0000ff;
          uStack_70 = 0xffff6000ff00ff00;
          r_00.x = nVar2.x + -5.0;
          r_00.y = nVar2.y + -5.0;
          r_00.w = 10.0;
          r_00.h = 10.0;
          nk_fill_circle(b,r_00,*(nk_color *)((long)&local_78 + uVar8 * 4));
          nk_text_colored(&glfw.ctx,"",0,0,glfw.ctx.style.text.color);
          nk_layout_row_push(&glfw.ctx,500.0);
          if (uVar8 == 0) {
            nk_text_colored(&glfw.ctx,"- current cursor position (no input lag)",0x28,0x11,
                            glfw.ctx.style.text.color);
          }
          else {
            nk_labelf(&glfw.ctx,0x11,"- %d-frame forecast (input lag is %d frame)",
                      uVar8 & 0xffffffff,uVar8 & 0xffffffff);
          }
          nk_layout_row_end(&glfw.ctx);
          uVar8 = uVar8 + 1;
        } while (uVar8 != 4);
        nk_row_layout(&glfw.ctx,NK_DYNAMIC,20.0,1,0);
        local_8c = nk_check_text(&glfw.ctx,"Show forecasts",0xe,local_8c);
        nk_text_colored(&glfw.ctx,"Input method:",0xd,0x11,glfw.ctx.style.text.color);
        iVar5 = nk_option_text(&glfw.ctx,"glfwGetCursorPos (sync query)",0x1d,
                               (uint)(cursor_method == NK_DO_NOT_STOP_ON_NEW_LINE));
        handle_00 = local_80;
        if (iVar5 == 0) {
          is_active = (uint)(cursor_method == NK_STOP_ON_NEW_LINE);
        }
        else {
          cursor_method = NK_DO_NOT_STOP_ON_NEW_LINE;
          is_active = 0;
        }
        iVar5 = nk_option_text(&glfw.ctx,"glfwSetCursorPosCallback (latest input message)",0x2f,
                               is_active);
        if (iVar5 != 0) {
          cursor_method = NK_STOP_ON_NEW_LINE;
        }
        nk_text_colored(&glfw.ctx,"",0,0,glfw.ctx.style.text.color);
        nk_labelf(&glfw.ctx,0x11,"%s: %.3f",SUB84((double)(float)local_68,0),"FPS");
        iVar5 = enable_vsync;
        enable_vsync = nk_check_text(&glfw.ctx,"Enable vsync",0xc,enable_vsync);
        if (iVar5 != enable_vsync) {
          glfwSwapInterval((uint)(enable_vsync == 1));
        }
        nk_text_colored(&glfw.ctx,"",0,0,glfw.ctx.style.text.color);
        nk_text_colored(&glfw.ctx,"After swap:",0xb,0x11,glfw.ctx.style.text.color);
        swap_clear = nk_check_text(&glfw.ctx,"glClear",7,swap_clear);
        swap_finish = nk_check_text(&glfw.ctx,"glFinish",8,swap_finish);
        swap_occlusion_query =
             nk_check_text(&glfw.ctx,"draw with occlusion query",0x19,swap_occlusion_query);
        swap_read_pixels = nk_check_text(&glfw.ctx,"glReadPixels",0xc,swap_read_pixels);
      }
      nk_end(&glfw.ctx);
      nk_glfw3_render(NK_ANTI_ALIASING_ON);
      swap_buffers(handle_00);
      lVar9 = lVar9 + 1;
      dVar1 = glfwGetTime();
      dVar3 = dVar1 - (double)local_58._0_8_;
      auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = 0x45300000;
      dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
      if (1.0 < dVar3) {
        local_68 = (dVar12 + ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / dVar3
        ;
        dStack_60 = dVar12;
      }
      uVar8 = -(ulong)(1.0 < dVar3);
      local_58._0_8_ =
           ~uVar8 & local_58._0_8_ |
           CONCAT44((uint)((ulong)dVar1 >> 0x20) & (uint)(uVar8 >> 0x20),
                    SUB84(dVar1,0) & (uint)uVar8);
      if (1.0 < dVar3) {
        lVar9 = 0;
      }
      iVar5 = glfwWindowShouldClose(handle_00);
    } while (iVar5 == 0);
  }
  glfwTerminate();
  goto LAB_00140cdb;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    unsigned long frame_count = 0;
    double last_time, current_time;
    double frame_rate = 0;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    int show_forecasts = nk_true;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(width, height, "Input lag test", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    update_vsync();

    last_time = glfwGetTime();

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);
    glfwSetCursorPosCallback(window, cursor_pos_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwPollEvents();
        sample_input(window);

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            nk_flags align_left = NK_TEXT_ALIGN_LEFT | NK_TEXT_ALIGN_MIDDLE;
            struct nk_command_buffer *canvas = nk_window_get_canvas(nk);
            int lead;

            for (lead = show_forecasts ? 3 : 0; lead >= 0; lead--)
                draw_marker(canvas, lead, nk_vec2(cursor_pos.x + cursor_vel.x * lead,
                                                  cursor_pos.y + cursor_vel.y * lead));

            // print instructions
            nk_layout_row_dynamic(nk, 20, 1);
            nk_label(nk, "Move mouse uniformly and check marker under cursor:", align_left);
            for (lead = 0; lead <= 3; lead++) {
                nk_layout_row_begin(nk, NK_STATIC, 12, 2);
                nk_layout_row_push(nk, 25);
                draw_marker(canvas, lead, nk_layout_space_to_screen(nk, nk_vec2(20, 5)));
                nk_label(nk, "", 0);
                nk_layout_row_push(nk, 500);
                if (lead == 0)
                    nk_label(nk, "- current cursor position (no input lag)", align_left);
                else
                    nk_labelf(nk, align_left, "- %d-frame forecast (input lag is %d frame)", lead, lead);
                nk_layout_row_end(nk);
            }

            nk_layout_row_dynamic(nk, 20, 1);

            nk_checkbox_label(nk, "Show forecasts", &show_forecasts);
            nk_label(nk, "Input method:", align_left);
            if (nk_option_label(nk, "glfwGetCursorPos (sync query)", cursor_method == cursor_sync_query))
                cursor_method = cursor_sync_query;
            if (nk_option_label(nk, "glfwSetCursorPosCallback (latest input message)", cursor_method == cursor_input_message))
                cursor_method = cursor_input_message;

            nk_label(nk, "", 0); // separator

            nk_value_float(nk, "FPS", (float) frame_rate);
            if (nk_checkbox_label(nk, "Enable vsync", &enable_vsync))
                update_vsync();

            nk_label(nk, "", 0); // separator

            nk_label(nk, "After swap:", align_left);
            nk_checkbox_label(nk, "glClear", &swap_clear);
            nk_checkbox_label(nk, "glFinish", &swap_finish);
            nk_checkbox_label(nk, "draw with occlusion query", &swap_occlusion_query);
            nk_checkbox_label(nk, "glReadPixels", &swap_read_pixels);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        swap_buffers(window);

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}